

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     idiv<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination_high,modify_t<unsigned_short> destination_low,
               read_t<unsigned_short> source,Context *context)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  long lVar3;
  undefined6 in_register_00000012;
  
  if ((int)CONCAT62(in_register_00000012,source) != 0) {
    uVar1 = *destination_high;
    uVar2 = *destination_low;
    lVar3 = (long)CONCAT22(uVar1,uVar2) / (long)(int)(short)source;
    if ((int)lVar3 + 0x7fffU < 0x10000) {
      *destination_low = -(short)lVar3;
      *destination_high = (unsigned_short)(CONCAT22(uVar1,uVar2) % (int)(short)source);
      return;
    }
  }
  interrupt<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
            (0,context);
  return;
}

Assistant:

void idiv(
	modify_t<IntT> destination_high,
	modify_t<IntT> destination_low,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		IF SRC = 0
			THEN #DE; (* divide error *)
		FI;
		IF OperandSize = 8 (* word/byte operation *)
			THEN
				temp ← AX / SRC; (* signed division *)
				IF (temp > 7FH) OR (temp < 80H) (* if a positive result is greater than 7FH or a negative result is less than 80H *)
					THEN #DE; (* divide error *) ;
					ELSE
						AL ← temp;
						AH ← AX MOD SRC;
				FI;
		ELSE
			IF OperandSize = 16 (* doubleword/word operation *)
				THEN
					temp ← DX:AX / SRC; (* signed division *)
					IF (temp > 7FFFH) OR (temp < 8000H) (* if a positive result is greater than 7FFFH or a negative result is less than 8000H *)
						THEN #DE; (* divide error *) ;
						ELSE
							AX ← temp;
							DX ← DX:AX MOD SRC;
					FI;
				ELSE (* quadword/doubleword operation *)
					temp ← EDX:EAX / SRC; (* signed division *)
					IF (temp > 7FFFFFFFH) OR (temp < 80000000H) (* if a positive result is greater than 7FFFFFFFH or a negative result is less than 80000000H *)
						THEN #DE; (* divide error *) ;
						ELSE
							EAX ← temp;
							EDX ← EDX:EAX MOD SRC;
						FI;
			FI;
		FI;
	*/
	/*
		The CF, OF, SF, ZF, AF, and PF flags are undefined.
	*/
	if(!source) {
		interrupt(Interrupt::DivideError, context);
		return;
	}

	// TEMPORARY HACK. Will not work with DWords.
	using sIntT = typename std::make_signed<IntT>::type;
	const int32_t dividend = (sIntT(destination_high) << (8 * sizeof(IntT))) + destination_low;
	auto result = dividend / sIntT(source);

	// An 8086 quirk: rep IDIV performs an IDIV that switches the sign on its result,
	// due to reuse of an internal flag.
	if constexpr (invert) {
		result = -result;
	}

	if(sIntT(result) != result) {
		interrupt(Interrupt::DivideError, context);
		return;
	}

	destination_low = IntT(result);
	destination_high = IntT(dividend % sIntT(source));
}